

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void sockhash_destroy(Curl_hash *h)

{
  Curl_sh_entry *sh;
  Curl_hash_element *he;
  Curl_hash_iterator iter;
  Curl_hash *h_local;
  
  iter.current_element = (Curl_llist_element *)h;
  Curl_hash_start_iterate(h,(Curl_hash_iterator *)&he);
  sh = (Curl_sh_entry *)Curl_hash_next_element((Curl_hash_iterator *)&he);
  while (sh != (Curl_sh_entry *)0x0) {
    Curl_hash_destroy((Curl_hash *)(sh->transfers).dtor);
    sh = (Curl_sh_entry *)Curl_hash_next_element((Curl_hash_iterator *)&he);
  }
  Curl_hash_destroy((Curl_hash *)iter.current_element);
  return;
}

Assistant:

static void sockhash_destroy(struct Curl_hash *h)
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;

  DEBUGASSERT(h);
  Curl_hash_start_iterate(h, &iter);
  he = Curl_hash_next_element(&iter);
  while(he) {
    struct Curl_sh_entry *sh = (struct Curl_sh_entry *)he->ptr;
    Curl_hash_destroy(&sh->transfers);
    he = Curl_hash_next_element(&iter);
  }
  Curl_hash_destroy(h);
}